

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

uint64_t __thiscall CConnman::GetOutboundTargetBytesLeft(CConnman *this)

{
  char *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock100;
  Mutex *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *pcVar1;
  char *in_stack_ffffffffffffffe0;
  uint64_t uVar2;
  char *in_stack_ffffffffffffffe8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffff0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_00;
  
  this_00 = *(UniqueLock<AnnotatedMixin<std::mutex>_> **)(in_FS_OFFSET + 0x28);
  pcVar1 = in_RDI;
  AssertLockNotHeldInline
            (in_RDI,in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
             (Mutex *)0x101327d);
  MaybeCheckNotHeld(in_stack_ffffffffffffffb8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             (int)((ulong)pcVar1 >> 0x20),SUB81((ulong)pcVar1 >> 0x18,0));
  if (*(long *)(in_RDI + 0x48) == 0) {
    uVar2 = 0;
  }
  else if (*(ulong *)(in_RDI + 0x38) < *(ulong *)(in_RDI + 0x48)) {
    uVar2 = *(long *)(in_RDI + 0x48) - *(long *)(in_RDI + 0x38);
  }
  else {
    uVar2 = 0;
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffb8);
  if (*(UniqueLock<AnnotatedMixin<std::mutex>_> **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

uint64_t CConnman::GetOutboundTargetBytesLeft() const
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    LOCK(m_total_bytes_sent_mutex);
    if (nMaxOutboundLimit == 0)
        return 0;

    return (nMaxOutboundTotalBytesSentInCycle >= nMaxOutboundLimit) ? 0 : nMaxOutboundLimit - nMaxOutboundTotalBytesSentInCycle;
}